

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_call_detail.hpp
# Opt level: O0

Boxed_Value __thiscall
chaiscript::dispatch::detail::Build_Function_Caller_Helper<chaiscript::Boxed_Value>::operator()<>
          (Build_Function_Caller_Helper<chaiscript::Boxed_Value> *this)

{
  reference_wrapper<chaiscript::Type_Conversions::Conversion_Saves> *this_00;
  Type_Conversions *t_conversions;
  Conversion_Saves *pCVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  Function_Params *in_RSI;
  Boxed_Value BVar3;
  Function_Params local_120 [2];
  undefined1 local_100 [8];
  Type_Conversions_State state_1;
  Type_Conversions conv;
  undefined1 local_30 [8];
  Type_Conversions_State state;
  array<chaiscript::Boxed_Value,_0UL> params;
  Build_Function_Caller_Helper<chaiscript::Boxed_Value> *this_local;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  
  state.m_saves._M_data._7_1_ = 0;
  if (in_RSI[1].m_end == (Boxed_Value *)0x0) {
    this_00 = &state_1.m_saves;
    Type_Conversions::Type_Conversions((Type_Conversions *)this_00);
    pCVar1 = Type_Conversions::conversion_saves((Type_Conversions *)this_00);
    Type_Conversions_State::Type_Conversions_State
              ((Type_Conversions_State *)local_100,(Type_Conversions *)this_00,pCVar1);
    Function_Params::Function_Params<0ul>
              (local_120,(array<chaiscript::Boxed_Value,_0UL> *)((long)&state.m_saves._M_data + 7));
    call(this,in_RSI,(Type_Conversions_State *)local_120);
    Type_Conversions::~Type_Conversions((Type_Conversions *)&state_1.m_saves);
    _Var2._M_pi = extraout_RDX;
  }
  else {
    t_conversions = (Type_Conversions *)in_RSI[1].m_end;
    pCVar1 = Type_Conversions::conversion_saves((Type_Conversions *)in_RSI[1].m_end);
    Type_Conversions_State::Type_Conversions_State
              ((Type_Conversions_State *)local_30,t_conversions,pCVar1);
    Function_Params::Function_Params<0ul>
              ((Function_Params *)&conv.m_conversion_saves,
               (array<chaiscript::Boxed_Value,_0UL> *)((long)&state.m_saves._M_data + 7));
    BVar3 = call(this,in_RSI,(Type_Conversions_State *)&conv.m_conversion_saves);
    _Var2._M_pi = BVar3.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
  }
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var2._M_pi;
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Ret operator()(P &&...param) {
      std::array<Boxed_Value, sizeof...(P)> params{box<P>(std::forward<P>(param))...};

      if (m_conversions) {
        Type_Conversions_State state(*m_conversions, m_conversions->conversion_saves());
        return call(chaiscript::Function_Params{params}, state);
      } else {
        Type_Conversions conv;
        Type_Conversions_State state(conv, conv.conversion_saves());
        return call(chaiscript::Function_Params{params}, state);
      }
    }